

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O0

void __thiscall
sf2cute::SFPreset::SFPreset
          (SFPreset *this,string *name,uint16_t preset_number,uint16_t bank,
          vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *zones)

{
  bool bVar1;
  size_type __n;
  undefined1 local_60 [16];
  SFPresetZone *zone;
  iterator __end1;
  iterator __begin1;
  vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *__range1;
  vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *zones_local;
  uint16_t bank_local;
  uint16_t preset_number_local;
  string *name_local;
  SFPreset *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->preset_number_ = preset_number;
  this->bank_ = bank;
  this->library_ = 0;
  this->genre_ = 0;
  this->morphology_ = 0;
  (this->zones_).
  super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->zones_).
  super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->zones_).
  super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ::vector(&this->zones_);
  std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>::
  unique_ptr<std::default_delete<sf2cute::SFPresetZone>,void>
            ((unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>> *)
             &this->global_zone_,(nullptr_t)0x0);
  this->parent_file_ = (SoundFont *)0x0;
  __n = std::vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>::size(zones);
  std::
  vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ::reserve(&this->zones_,__n);
  __end1 = std::vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>::begin(zones);
  zone = (SFPresetZone *)
         std::vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>::end(zones);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<sf2cute::SFPresetZone_*,_std::vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>_>
                                *)&zone);
    if (!bVar1) break;
    local_60._8_8_ =
         __gnu_cxx::
         __normal_iterator<sf2cute::SFPresetZone_*,_std::vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>_>
         ::operator*(&__end1);
    std::make_unique<sf2cute::SFPresetZone,sf2cute::SFPresetZone>((SFPresetZone *)local_60);
    std::
    vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
    ::push_back(&this->zones_,(value_type *)local_60);
    std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>::~unique_ptr
              ((unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
               local_60);
    __gnu_cxx::
    __normal_iterator<sf2cute::SFPresetZone_*,_std::vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>_>
    ::operator++(&__end1);
  }
  SetBackwardReferences(this);
  return;
}

Assistant:

SFPreset::SFPreset(std::string name,
    uint16_t preset_number,
    uint16_t bank,
    std::vector<SFPresetZone> zones) :
    name_(std::move(name)),
    preset_number_(std::move(preset_number)),
    bank_(std::move(bank)),
    library_(0),
    genre_(0),
    morphology_(0),
    zones_(),
    global_zone_(nullptr),
    parent_file_(nullptr) {
  // Set preset zones.
  zones_.reserve(zones.size());
  for (auto && zone : zones) {
    zones_.push_back(std::make_unique<SFPresetZone>(std::move(zone)));
  }

  // Repair references.
  SetBackwardReferences();
}